

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEditPrivate::ensureCursorVisible(QPlainTextEditPrivate *this,bool center)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  QScrollBar *pQVar2;
  int iVar3;
  LayoutDirection LVar4;
  LayoutDirection LVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long in_FS_OFFSET;
  QRect QVar9;
  QWidgetTextControl local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  pQVar1 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  iVar3 = (pQVar1->crect).y2.m_i;
  iVar8 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  iVar6 = (pQVar1->crect).y1.m_i;
  QVar9 = QPlainTextEdit::cursorRect((QPlainTextEdit *)this_00);
  if ((QVar9._0_8_ < 0) || (iVar3 - iVar6 < QVar9.y2.m_i.m_i)) {
    QWidgetTextControl::textCursor(local_40);
    iVar3 = QTextCursor::position();
    ensureVisible(this,iVar3,center,false);
    QTextCursor::~QTextCursor((QTextCursor *)local_40);
  }
  LVar4 = QWidget::layoutDirection(this_00);
  if ((QVar9.x1.m_i.m_i < 0) || (iVar8 < QVar9.x2.m_i.m_i)) {
    lVar7 = (long)QVar9.x2.m_i.m_i + (long)QVar9.x1.m_i.m_i;
    LVar5 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    pQVar2 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar5 == RightToLeft) {
      iVar3 = QAbstractSlider::maximum(&pQVar2->super_QAbstractSlider);
      iVar6 = QAbstractSlider::value
                        (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
      iVar3 = iVar3 - iVar6;
    }
    else {
      iVar3 = QAbstractSlider::value(&pQVar2->super_QAbstractSlider);
    }
    iVar3 = ((int)((ulong)(lVar7 - (lVar7 >> 0x3f)) >> 1) - ((iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1)
            ) + iVar3;
    pQVar2 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar4 == RightToLeft) {
      iVar6 = QAbstractSlider::maximum(&pQVar2->super_QAbstractSlider);
      iVar3 = iVar6 - iVar3;
    }
    QAbstractSlider::setValue(&pQVar2->super_QAbstractSlider,iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::ensureCursorVisible(bool center)
{
    Q_Q(QPlainTextEdit);
    QRect visible = viewport->rect();
    QRect cr = q->cursorRect();
    if (cr.top() < visible.top() || cr.bottom() > visible.bottom()) {
        ensureVisible(control->textCursor().position(), center);
    }

    const bool rtl = q->isRightToLeft();
    if (cr.left() < visible.left() || cr.right() > visible.right()) {
        int x = cr.center().x() + horizontalOffset() - visible.width()/2;
        hbar->setValue(rtl ? hbar->maximum() - x : x);
    }
}